

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# in.c
# Opt level: O1

LY_ERR ly_in_new_fd(int fd,ly_in **in)

{
  LY_ERR LVar1;
  ly_in *plVar2;
  char *pcVar3;
  char *addr;
  size_t length;
  char *local_28;
  size_t local_20;
  
  if (fd < 0) {
    pcVar3 = "fd >= 0";
  }
  else {
    if (in != (ly_in **)0x0) {
      LVar1 = ly_mmap((ly_ctx *)0x0,fd,&local_20,&local_28);
      pcVar3 = local_28;
      if (LVar1 != LY_SUCCESS) {
        return LVar1;
      }
      if (local_28 != (char *)0x0) {
        plVar2 = (ly_in *)calloc(1,0x40);
        *in = plVar2;
        if (plVar2 != (ly_in *)0x0) {
          plVar2->type = LY_IN_FD;
          (plVar2->method).fd = fd;
          plVar2->func_start = pcVar3;
          plVar2->start = pcVar3;
          plVar2->current = pcVar3;
          plVar2->line = 1;
          plVar2->length = local_20;
          return LY_SUCCESS;
        }
        ly_log((ly_ctx *)0x0,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","ly_in_new_fd");
        ly_munmap(local_28,local_20);
        return LY_EMEM;
      }
      ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Empty input file.");
      return LY_EINVAL;
    }
    pcVar3 = "in";
  }
  ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).",pcVar3,"ly_in_new_fd");
  return LY_EINVAL;
}

Assistant:

LIBYANG_API_DEF LY_ERR
ly_in_new_fd(int fd, struct ly_in **in)
{
    size_t length;
    char *addr;

    LY_CHECK_ARG_RET(NULL, fd >= 0, in, LY_EINVAL);

    LY_CHECK_RET(ly_mmap(NULL, fd, &length, (void **)&addr));
    if (!addr) {
        LOGERR(NULL, LY_EINVAL, "Empty input file.");
        return LY_EINVAL;
    }

    *in = calloc(1, sizeof **in);
    LY_CHECK_ERR_RET(!*in, LOGMEM(NULL); ly_munmap(addr, length), LY_EMEM);

    (*in)->type = LY_IN_FD;
    (*in)->method.fd = fd;
    (*in)->current = (*in)->start = (*in)->func_start = addr;
    (*in)->line = 1;
    (*in)->length = length;

    return LY_SUCCESS;
}